

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

path * GetDefaultDataDir(void)

{
  path *in_RDI;
  long in_FS_OFFSET;
  char *pszHome;
  path pathRet;
  char *local_a0;
  char *local_98;
  path local_90;
  path local_68;
  path local_40;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_40);
  local_a0 = getenv("HOME");
  if ((local_a0 == (char *)0x0) || (*local_a0 == '\0')) {
    local_98 = "/";
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_68,&local_98,auto_format);
    GetDefaultDataDir();
  }
  else {
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&local_68,&local_a0,auto_format);
    GetDefaultDataDir();
  }
  std::filesystem::__cxx11::path::path(&local_90,&local_40);
  std::filesystem::__cxx11::path::_M_append(&local_90,8,".bitcoin");
  std::filesystem::__cxx11::path::path(in_RDI,&local_90);
  std::filesystem::__cxx11::path::~path(&local_90);
  std::filesystem::__cxx11::path::~path(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (path *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

fs::path GetDefaultDataDir()
{
    // Windows:
    //   old: C:\Users\Username\AppData\Roaming\Bitcoin
    //   new: C:\Users\Username\AppData\Local\Bitcoin
    // macOS: ~/Library/Application Support/Bitcoin
    // Unix-like: ~/.bitcoin
#ifdef WIN32
    // Windows
    // Check for existence of datadir in old location and keep it there
    fs::path legacy_path = GetSpecialFolderPath(CSIDL_APPDATA) / "Bitcoin";
    if (fs::exists(legacy_path)) return legacy_path;

    // Otherwise, fresh installs can start in the new, "proper" location
    return GetSpecialFolderPath(CSIDL_LOCAL_APPDATA) / "Bitcoin";
#else
    fs::path pathRet;
    char* pszHome = getenv("HOME");
    if (pszHome == nullptr || strlen(pszHome) == 0)
        pathRet = fs::path("/");
    else
        pathRet = fs::path(pszHome);
#ifdef MAC_OSX
    // macOS
    return pathRet / "Library/Application Support/Bitcoin";
#else
    // Unix-like
    return pathRet / ".bitcoin";
#endif
#endif
}